

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.h
# Opt level: O2

void booster::ptime::millisleep(longlong v)

{
  ptime pVar1;
  ptime local_10;
  
  pVar1 = milliseconds(v);
  local_10.sec = pVar1.sec;
  local_10.nsec = pVar1.nsec;
  booster::ptime::sleep(&local_10);
  return;
}

Assistant:

static void millisleep(long long v)
		{
			sleep(milliseconds(v));
		}